

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O0

_Bool trans_fcvt_s_d(DisasContext_conflict12 *ctx,arg_fcvt_s_d *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict11 *tcg_ctx;
  arg_fcvt_s_d *a_local;
  DisasContext_conflict12 *ctx_local;
  
  if (ctx->mstatus_fs == 0) {
    ctx_local._7_1_ = false;
  }
  else {
    _Var1 = has_ext(ctx,8);
    if (_Var1) {
      tcg_ctx_00 = ctx->uc->tcg_ctx;
      gen_set_rm(ctx,a->rm);
      gen_helper_fcvt_s_d(tcg_ctx_00,tcg_ctx_00->cpu_fpr[a->rd],tcg_ctx_00->cpu_env,
                          tcg_ctx_00->cpu_fpr[a->rs1]);
      mark_fs_dirty(ctx);
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_fcvt_s_d(DisasContext *ctx, arg_fcvt_s_d *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVD);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    gen_set_rm(ctx, a->rm);
    gen_helper_fcvt_s_d(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_env, tcg_ctx->cpu_fpr[a->rs1]);

    mark_fs_dirty(ctx);
    return true;
}